

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

double expected_separation_depth<double>(double n)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double diff;
  double s_u;
  double u;
  double s_l;
  size_t in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if (in_XMM0_Qa < 87670.0) {
    floor(in_XMM0_Qa);
    local_8 = expected_separation_depth(in_stack_ffffffffffffffc8);
    dVar1 = ceil(in_XMM0_Qa);
    dVar2 = floor(in_XMM0_Qa);
    local_8 = (in_XMM0_Qa - dVar2) *
              (local_8 + ((-local_8 * dVar1 + dVar1 * 3.0) - 4.0) / (dVar1 * (dVar1 - 1.0))) +
              local_8;
  }
  else {
    local_8 = 3.0;
  }
  return local_8;
}

Assistant:

double expected_separation_depth(ldouble_safe n)
{
    if (n >= THRESHOLD_EXACT_S)
        return 3;
    double s_l = expected_separation_depth((size_t) std::floor(n));
    ldouble_safe u = std::ceil(n);
    double s_u = s_l + (-s_l * u + 3. * u - 4.) / (u * (u - 1.));
    double diff = n - std::floor(n);
    return s_l + diff * s_u;
}